

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall Timer::removeTimedEvent(Timer *this,Event *ev)

{
  iterator iVar1;
  iterator node;
  AutoLock _auto_lock_;
  TimerNode timer;
  Node *local_78;
  iterator local_70;
  AutoLock local_68;
  TimerNode local_50;
  
  local_50.mEvent.mObj = (Event *)0x0;
  AutoLock::AutoLock(&local_68,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0x186);
  local_78 = ((this->mList).mHead)->next;
  iVar1.mNode = local_78;
  while (iVar1.mNode != (this->mList).mTail) {
    TimerNode::operator=(&local_50,&(iVar1.mNode)->val);
    if (local_50.mEvent.mObj == ev) {
      JetHead::list<Timer::TimerNode>::iterator::erase(&local_70);
      local_78 = local_70.mNode;
      iVar1.mNode = local_70.mNode;
    }
    else {
      iVar1.mNode = (Node *)0x0;
      if (local_78 != (Node *)0x0) {
        local_78 = local_78->next;
        iVar1.mNode = local_78;
      }
    }
  }
  AutoLock::~AutoLock(&local_68);
  SmartPtr<Event>::~SmartPtr(&local_50.mEvent);
  return;
}

Assistant:

void Timer::removeTimedEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	TimerNode timer;
	
	DebugAutoLock( mMutex );

	JetHead::list<TimerNode>::iterator node = mList.begin();
	while (node != mList.end())
	{
		// Cast the node as a TimerNode
		timer = *node;
		
		// Check if the timer node has an event for the dispatcher
		// specified
		if ( (Event*)timer.mEvent == ev )
		{
			node = node.erase();
			continue;
		}
		++node;
	}	
}